

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  bool bVar1;
  int32_t iVar2;
  undefined8 **ppuVar3;
  GCobj *pGVar4;
  GCobj **ppGVar5;
  uint uVar6;
  bool bVar7;
  undefined8 *local_68 [2];
  GCobj *local_58 [2];
  undefined8 **local_48;
  undefined8 *local_40;
  GCobj *local_38;
  
  ppuVar3 = local_68;
  uVar6 = 0;
  ppGVar5 = local_58;
  bVar7 = true;
  while( true ) {
    local_48 = ppuVar3;
    pGVar4 = (GCobj *)lj_lib_checkfunc(L,uVar6 | 1);
    *ppGVar5 = pGVar4;
    if ((pGVar4->gch).unused1 != '\0') {
      lj_err_arg(L,uVar6 | 1,LJ_ERR_NOLFUNC);
    }
    iVar2 = lj_lib_checkint(L,uVar6 + 2);
    if ((uint)(pGVar4->gch).unused2 <= iVar2 - 1U) break;
    *local_48 = (undefined8 *)((long)pGVar4 + (ulong)(iVar2 - 1U) * 8 + 0x28);
    uVar6 = 2;
    ppuVar3 = &local_40;
    ppGVar5 = &local_38;
    bVar1 = !bVar7;
    bVar7 = false;
    if (bVar1) {
      pGVar4 = (GCobj *)*local_40;
      *local_68[0] = pGVar4;
      if ((((pGVar4->gch).marked & 3) != 0) && (((local_58[0]->gch).marked & 4) != 0)) {
        lj_gc_barrierf((global_State *)(L->glref).ptr64,local_58[0],pGVar4);
      }
      return 0;
    }
  }
  lj_err_arg(L,uVar6 + 2,LJ_ERR_IDXRNG);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}